

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I210ToARGBRow_C(uint16_t *src_y,uint16_t *src_u,uint16_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  long in_RSI;
  uint8_t *in_R8;
  uint in_R9D;
  YuvConstants *unaff_retaddr;
  int x;
  int local_30;
  uint16_t v;
  uint16_t u;
  uint16_t y;
  
  for (local_30 = 0; v = (uint16_t)((ulong)in_RSI >> 0x10), u = (uint16_t)((ulong)in_RSI >> 0x20),
      y = (uint16_t)((ulong)in_RSI >> 0x30), local_30 < (int)(in_R9D - 1); local_30 = local_30 + 2)
  {
    libyuv::YuvPixel10(y,u,v,in_RDX,in_RCX,in_R8,unaff_retaddr);
    in_RCX[3] = 0xff;
    libyuv::YuvPixel10((uint16_t)((ulong)in_RSI >> 0x30),(uint16_t)((ulong)in_RSI >> 0x20),
                       (uint16_t)((ulong)in_RSI >> 0x10),in_RDX,in_RCX,in_R8,unaff_retaddr);
    in_RCX[7] = 0xff;
    in_RSI = in_RSI + 2;
    in_RDX = in_RDX + 2;
    in_RCX = in_RCX + 8;
  }
  if ((in_R9D & 1) != 0) {
    libyuv::YuvPixel10(y,u,v,in_RDX,in_RCX,in_R8,unaff_retaddr);
    in_RCX[3] = 0xff;
  }
  return;
}

Assistant:

void I210ToARGBRow_C(const uint16_t* src_y,
                     const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel10(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
               rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel10(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
               rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel10(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
               rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}